

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::readDisplayBuffer(MockGLEngine *this)

{
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t buffSize;
  int h;
  int w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buff;
  value_type_conflict4 *__value;
  size_type in_stack_ffffffffffffffc8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  value_type_conflict4 local_23 [3];
  allocator_type *local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 400;
  local_18 = 600;
  __a = (allocator_type *)0xea600;
  local_23[2] = 0;
  local_23[1] = 0;
  __value = local_23;
  local_20 = __a;
  geometrycentral::surface::std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)0x408ee2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,__value,__a);
  geometrycentral::surface::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)0x408f07);
  return in_RDI;
}

Assistant:

std::vector<unsigned char> MockGLEngine::readDisplayBuffer() {
  // Get buffer size
  int w = 400;
  int h = 600;

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize, 0);
  return buff;
}